

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O0

FPError * __thiscall phyr::FPError::operator/(FPError *this,FPError *fp)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RDX;
  double *in_RSI;
  FPError *in_RDI;
  double dVar3;
  FPError *ret;
  double _b [4];
  int delta;
  double in_stack_ffffffffffffffa8;
  double local_38;
  double local_30;
  double local_28;
  double local_20 [2];
  double *local_10;
  
  local_10 = in_RDX;
  FPError(in_RDI);
  in_RDI->v = *in_RSI / *local_10;
  if ((0.0 < local_10[1] || local_10[1] == 0.0) || (local_10[2] <= 0.0)) {
    local_38 = in_RSI[1] / local_10[1];
    local_30 = in_RSI[1] / local_10[2];
    local_28 = in_RSI[2] / local_10[1];
    local_20[0] = in_RSI[2] / local_10[2];
    pdVar1 = std::min<double>(&local_38,&local_30);
    pdVar2 = std::min<double>(&local_28,local_20);
    std::min<double>(pdVar1,pdVar2);
    delta = (int)((ulong)pdVar1 >> 0x20);
    dVar3 = nextFloatDown(in_stack_ffffffffffffffa8,delta);
    in_RDI->lBound = dVar3;
    pdVar1 = std::max<double>(&local_38,&local_30);
    pdVar2 = std::max<double>(&local_28,local_20);
    std::max<double>(pdVar1,pdVar2);
    dVar3 = nextFloatUp((double)pdVar1,delta);
    in_RDI->uBound = dVar3;
  }
  else {
    in_RDI->lBound = -INFINITY;
    in_RDI->uBound = INFINITY;
  }
  return in_RDI;
}

Assistant:

FPError operator/(const FPError& fp) const {
        FPError ret;
        ret.v = v / fp.v;

        if (fp.lBound < 0 && fp.uBound > 0) {
            ret.lBound = -Infinity; ret.uBound = Infinity;
        } else {
            Real _b[4] = {
                lBound / fp.lBound, lBound / fp.uBound,
                uBound / fp.lBound, uBound / fp.uBound
            };
            ret.lBound = nextFloatDown(std::min(std::min(_b[0], _b[1]), std::min(_b[2], _b[3])));
            ret.uBound = nextFloatUp(std::max(std::max(_b[0], _b[1]), std::max(_b[2], _b[3])));
        }

        return ret;
    }